

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_undo.c
# Opt level: O1

void pd_undo_set_objectstate
               (_glist *canvas,t_pd *x,t_symbol *s,int undo_argc,t_atom *undo_argv,int redo_argc,
               t_atom *redo_argv)

{
  int iVar1;
  int iVar2;
  _undo *p_Var3;
  long lVar4;
  int *data;
  _binbuf *p_Var5;
  int iVar6;
  bool bVar7;
  
  iVar2 = glist_getindex(canvas,(t_gobj *)x);
  p_Var3 = canvas_undo_get(canvas);
  if ((p_Var3 == (_undo *)0x0) || (p_Var3->u_doing == 0)) {
    if (undo_argc != redo_argc) {
LAB_00165d73:
      data = (int *)getbytes(0x20);
      *data = iVar2;
      *(t_symbol **)(data + 2) = s;
      p_Var5 = binbuf_new();
      *(_binbuf **)(data + 4) = p_Var5;
      p_Var5 = binbuf_new();
      *(_binbuf **)(data + 6) = p_Var5;
      binbuf_add(*(_binbuf **)(data + 4),undo_argc,undo_argv);
      binbuf_add(*(_binbuf **)(data + 6),redo_argc,redo_argv);
      canvas_undo_add(canvas,UNDO_OBJECT_STATE,"state",data);
      return;
    }
    if (0 < undo_argc) {
      lVar4 = 8;
      iVar6 = undo_argc;
      do {
        iVar1 = *(int *)((long)undo_argv + lVar4 + -8);
        if (iVar1 != *(int *)((long)redo_argv + lVar4 + -8)) goto LAB_00165d73;
        if (iVar1 == 2) {
          bVar7 = *(long *)((long)&undo_argv->a_type + lVar4) ==
                  *(long *)((long)&redo_argv->a_type + lVar4);
        }
        else {
          if (iVar1 != 1) goto LAB_00165d73;
          bVar7 = *(float *)((long)&redo_argv->a_type + lVar4) ==
                  *(float *)((long)&undo_argv->a_type + lVar4);
        }
        if (!bVar7) goto LAB_00165d73;
        lVar4 = lVar4 + 0x10;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
  }
  return;
}

Assistant:

void pd_undo_set_objectstate(t_canvas*canvas, t_pd*x, t_symbol*s,
                                    int undo_argc, t_atom*undo_argv,
                                    int redo_argc, t_atom*redo_argv)
{
    t_undo_object_state *buf;
    int pos = glist_getindex(canvas, (t_gobj*)x);
    t_undo *udo = canvas_undo_get(canvas);
    if (udo && udo->u_doing)
        return;
    if(lists_are_equal(undo_argc, undo_argv, redo_argc, redo_argv))
        return;

    buf = (t_undo_object_state*)getbytes(sizeof(t_undo_object_state));
    buf->u_obj = pos;
    buf->u_symbol = s;
    buf->u_undo = binbuf_new();
    buf->u_redo = binbuf_new();
    binbuf_add(buf->u_undo, undo_argc, undo_argv);
    binbuf_add(buf->u_redo, redo_argc, redo_argv);
#if 0
    startpost("UNDO:"); binbuf_print(buf->u_undo);
    startpost("REDO:"); binbuf_print(buf->u_redo);
#endif
    canvas_undo_add(canvas, UNDO_OBJECT_STATE, "state", buf);
}